

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::async_err_writeln(Nvim *this,string *str)

{
  allocator local_39;
  string local_38;
  string *local_18;
  string *str_local;
  Nvim *this_local;
  
  local_18 = str;
  str_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"nvim_err_writeln",&local_39);
  NvimRPC::async_call<std::__cxx11::string>(&this->client_,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void Nvim::async_err_writeln(const std::string& str) {
    client_.async_call("nvim_err_writeln", str);
}